

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O0

bool __thiscall
despot::option::Parser::StoreOptionAction::perform(StoreOptionAction *this,Option *option)

{
  uint uVar1;
  Option *pOVar2;
  Option *new_last;
  int idx;
  Option *option_local;
  StoreOptionAction *this_local;
  
  if ((this->bufmax < 0) || (this->parser->op_count < this->bufmax)) {
    if (this->parser->op_count == 0x7fffffff) {
      return false;
    }
    Option::operator=(this->buffer + this->parser->op_count,option);
    uVar1 = (this->buffer[this->parser->op_count].desc)->index;
    pOVar2 = Option::operator_cast_to_Option_(this->options + (int)uVar1);
    if (pOVar2 == (Option *)0x0) {
      Option::operator=(this->options + (int)uVar1,this->buffer + this->parser->op_count);
    }
    else {
      pOVar2 = this->options;
      new_last = Option::operator_cast_to_Option_(this->buffer + this->parser->op_count);
      Option::append(pOVar2 + (int)uVar1,new_last);
    }
    this->parser->op_count = this->parser->op_count + 1;
  }
  return true;
}

Assistant:

bool perform(Option& option) {
		if (bufmax < 0 || parser.op_count < bufmax) {
			if (parser.op_count == 0x7fffffff)
				return false; // overflow protection: don't accept number of options that doesn't fit signed int

			buffer[parser.op_count] = option;
			int idx = buffer[parser.op_count].desc->index;
			if (options[idx])
				options[idx].append(buffer[parser.op_count]);
			else
				options[idx] = buffer[parser.op_count];
			++parser.op_count;
		}
		return true; // NOTE: an option that is discarded because of a full buffer is not fatal
	}